

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleditemdelegate.cpp
# Opt level: O2

void __thiscall
QStyledItemDelegate::paint
          (QStyledItemDelegate *this,QPainter *painter,QStyleOptionViewItem *option,
          QModelIndex *index)

{
  long lVar1;
  QWidget *this_00;
  QStyle *pQVar2;
  long in_FS_OFFSET;
  QStyleOptionViewItem opt;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&opt,0xaa,0xd0);
  QStyleOptionViewItem::QStyleOptionViewItem(&opt,option);
  (**(code **)(*(long *)this + 0xb8))(this,&opt,index);
  this_00 = option->widget;
  if (this_00 == (QWidget *)0x0) {
    pQVar2 = QApplication::style();
  }
  else {
    pQVar2 = QWidget::style(this_00);
  }
  (**(code **)(*(long *)pQVar2 + 0xb8))(pQVar2,0x2d,&opt,painter,this_00);
  QStyleOptionViewItem::~QStyleOptionViewItem(&opt);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QStyledItemDelegate::paint(QPainter *painter,
        const QStyleOptionViewItem &option, const QModelIndex &index) const
{
    Q_ASSERT(index.isValid());

    QStyleOptionViewItem opt = option;
    initStyleOption(&opt, index);

    const QWidget *widget = QStyledItemDelegatePrivate::widget(option);
    QStyle *style = widget ? widget->style() : QApplication::style();
    style->drawControl(QStyle::CE_ItemViewItem, &opt, painter, widget);
}